

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O2

int run_test_tty_pty(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b_1;
  int64_t eval_b_2;
  int slave_fd;
  int master_fd;
  winsize w;
  uv_tty_t master_tty;
  uv_tty_t slave_tty;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&loop);
  master_tty.data = (void *)(long)iVar1;
  slave_tty.data = (void *)0x0;
  if (master_tty.data == (void *)0x0) {
    iVar1 = openpty(&master_fd,&slave_fd,0,0,&w);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s\n","No pty available, skipping.");
      fflush(_stderr);
      return 7;
    }
    iVar1 = uv_tty_init(&loop,&slave_tty,slave_fd,0);
    master_tty.data = (void *)(long)iVar1;
    if (master_tty.data == (void *)0x0) {
      iVar1 = uv_tty_init(&loop,&master_tty,master_fd,0);
      eval_b_1 = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b_1 != (void *)0x0) {
        pcVar4 = "0";
        pcVar3 = "uv_tty_init(&loop, &master_tty, master_fd, 0)";
        uVar2 = 0x1ab;
        goto LAB_0019c64f;
      }
      iVar1 = uv_is_readable((uv_stream_t *)&slave_tty);
      if (iVar1 == 0) {
        pcVar3 = "uv_is_readable((uv_stream_t*) &slave_tty)";
        uVar2 = 0x1ac;
LAB_0019c566:
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,uVar2,pcVar3);
        abort();
      }
      iVar1 = uv_is_writable((uv_stream_t *)&slave_tty);
      if (iVar1 == 0) {
        pcVar3 = "uv_is_writable((uv_stream_t*) &slave_tty)";
        uVar2 = 0x1ad;
        goto LAB_0019c566;
      }
      iVar1 = uv_is_readable((uv_stream_t *)&master_tty);
      if (iVar1 == 0) {
        pcVar3 = "uv_is_readable((uv_stream_t*) &master_tty)";
        uVar2 = 0x1ae;
        goto LAB_0019c566;
      }
      iVar1 = uv_is_writable((uv_stream_t *)&master_tty);
      if (iVar1 == 0) {
        pcVar3 = "uv_is_writable((uv_stream_t*) &master_tty)";
        uVar2 = 0x1af;
        goto LAB_0019c566;
      }
      eval_b_1 = (int64_t)(slave_tty.flags & 0x100000);
      eval_b_2 = 0;
      if ((void *)eval_b_1 == (void *)0x0) {
        if ((master_tty.flags._2_1_ & 0x10) == 0) {
          pcVar3 = "master_tty.flags & 0x100000";
          uVar2 = 0x1b6;
          goto LAB_0019c566;
        }
        iVar1 = close(slave_fd);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b_1 == (void *)0x0) {
          uv_close((uv_handle_t *)&slave_tty,(uv_close_cb)0x0);
          iVar1 = close(master_fd);
          eval_b_1 = (int64_t)iVar1;
          eval_b_2 = 0;
          if ((void *)eval_b_1 == (void *)0x0) {
            uv_close((uv_handle_t *)&master_tty,(uv_close_cb)0x0);
            iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
            eval_b_1 = (int64_t)iVar1;
            eval_b_2 = 0;
            if ((void *)eval_b_1 == (void *)0x0) {
              close_loop(&loop);
              eval_b_1 = 0;
              iVar1 = uv_loop_close(&loop);
              eval_b_2 = (int64_t)iVar1;
              if (eval_b_2 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "uv_loop_close(&loop)";
              pcVar3 = "0";
              uVar2 = 0x1be;
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_run(&loop, UV_RUN_DEFAULT)";
              uVar2 = 0x1bc;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "close(master_fd)";
            uVar2 = 0x1b9;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "close(slave_fd)";
          uVar2 = 0x1b7;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "(slave_tty.flags & 0x100000)";
        uVar2 = 0x1b3;
      }
      goto LAB_0019c64f;
    }
    pcVar3 = "uv_tty_init(&loop, &slave_tty, slave_fd, 0)";
    uVar2 = 0x1aa;
  }
  else {
    pcVar3 = "uv_loop_init(&loop)";
    uVar2 = 0x1a4;
  }
  eval_b_2 = 0;
  pcVar4 = "0";
  eval_b_1 = (int64_t)master_tty.data;
LAB_0019c64f:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b_1,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(tty_pty) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif

#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT_OK(uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT_OK(uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT_OK(uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT_OK((slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT_OK(close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT_OK(close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(&loop);
#endif
  return 0;
}